

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_adaptor.hpp
# Opt level: O0

span<const_char,_18446744073709551615UL> __thiscall
jsoncons::
text_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::read_buffer(text_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this,error_code *ec)

{
  bool bVar1;
  pointer pcVar2;
  error_code *this_00;
  long in_RDI;
  type tVar3;
  type r;
  size_t length;
  value_type *data;
  span<const_char,_18446744073709551615UL> s;
  undefined4 in_stack_ffffffffffffffb8;
  json_errc in_stack_ffffffffffffffbc;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  pointer local_38;
  span<const_char,_18446744073709551615UL> local_30 [2];
  span<const_char,_18446744073709551615UL> local_10;
  
  bVar1 = iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eof((iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x4a942c);
  if (bVar1) {
    detail::span<const_char,_18446744073709551615UL>::span(&local_10);
  }
  else {
    local_30[0] = iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::read_buffer(in_stack_ffffffffffffffc0);
    pcVar2 = detail::span<const_char,_18446744073709551615UL>::data(local_30);
    this_00 = (error_code *)detail::span<const_char,_18446744073709551615UL>::size(local_30);
    local_38 = pcVar2;
    if (((*(byte *)(in_RDI + 0x38) & 1) != 0) && (this_00 != (error_code *)0x0)) {
      tVar3 = unicode_traits::detect_encoding_from_bom<char>
                        ((char *)this_00,
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      local_38 = tVar3.ptr;
      if ((tVar3.encoding != utf8) && (tVar3.encoding != undetected)) {
        std::error_code::operator=(this_00,in_stack_ffffffffffffffbc);
        detail::span<const_char,_18446744073709551615UL>::span(&local_10);
        return local_10;
      }
      this_00 = (error_code *)((long)this_00 - ((long)local_38 - (long)pcVar2));
      *(undefined1 *)(in_RDI + 0x38) = 0;
    }
    detail::span<const_char,_18446744073709551615UL>::span(&local_10,local_38,(size_type)this_00);
  }
  return local_10;
}

Assistant:

span<const value_type> read_buffer(std::error_code& ec)
        {
            if (source_.eof())
            {
                return span<const value_type>();
            }

            auto s = source_.read_buffer();
            const value_type* data = s.data();
            std::size_t length = s.size();

            if (bof_ && length > 0)
            {
                auto r = unicode_traits::detect_encoding_from_bom(data, length);
                if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
                {
                    ec = json_errc::illegal_unicode_character;
                    return span<const value_type>();
                }
                length -= (r.ptr - data);
                data = r.ptr;
                bof_ = false;
            }
            return span<const value_type>(data, length);           
        }